

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tally.cpp
# Opt level: O1

TallyState * __thiscall ccs::TallyState::activate(TallyState *this,Node *leg,Specificity *spec)

{
  uint uVar1;
  AndTally *pAVar2;
  TallyState *pTVar3;
  
  pTVar3 = (TallyState *)operator_new(0x20);
  pAVar2 = this->tally;
  pTVar3->tally = pAVar2;
  pTVar3->firstMatched = false;
  pTVar3->secondMatched = false;
  (pTVar3->firstMatch).names = 0;
  (pTVar3->firstMatch).values = 0;
  (pTVar3->secondMatch).names = 0;
  (pTVar3->secondMatch).values = 0;
  pTVar3->firstMatched = this->firstMatched;
  pTVar3->firstMatch = this->firstMatch;
  pTVar3->secondMatched = this->secondMatched;
  pTVar3->secondMatch = this->secondMatch;
  if ((pAVar2->super_Tally).firstLeg_ == leg) {
    pTVar3->firstMatched = true;
    uVar1 = (pTVar3->firstMatch).values;
    if ((uVar1 < spec->values) ||
       ((uVar1 == spec->values && ((pTVar3->firstMatch).names < spec->names)))) {
      pTVar3->firstMatch = *spec;
    }
  }
  if ((pAVar2->super_Tally).secondLeg_ == leg) {
    pTVar3->secondMatched = true;
    uVar1 = (pTVar3->secondMatch).values;
    if ((uVar1 < spec->values) ||
       ((uVar1 == spec->values && ((pTVar3->secondMatch).names < spec->names)))) {
      pTVar3->secondMatch = *spec;
    }
  }
  return pTVar3;
}

Assistant:

TallyState *TallyState::activate(const Node &leg,
    const Specificity &spec) const {
  // NB reference equality in the below...
  TallyState *next = clone();
  if (&tally.firstLeg_ == &leg) {
    next->firstMatched = true;
    if (next->firstMatch < spec) next->firstMatch = spec;
  }
  if (&tally.secondLeg_ == &leg) {
    next->secondMatched = true;
    if (next->secondMatch < spec) next->secondMatch = spec;
  }
  return next;
}